

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low_level_alloc.cc
# Opt level: O0

void __thiscall
tcmalloc::DefaultPagesAllocator::UnMapPages(DefaultPagesAllocator *this,void *region,size_t size)

{
  int iVar1;
  size_t sVar2;
  int munmap_result;
  size_t pagesize;
  size_t size_local;
  void *region_local;
  DefaultPagesAllocator *this_local;
  
  sVar2 = cached_pagesize();
  if ((ulong)region % sVar2 != 0) {
    syscall(1,2,
            "Check failed: reinterpret_cast<intptr_t>(region) % pagesize == 0: empty arena has non-page-aligned block\n"
            ,0x69);
    abort();
  }
  if (size % sVar2 != 0) {
    syscall(1,2,"Check failed: size % pagesize == 0: empty arena has non-page-aligned size\n",0x4a);
    abort();
  }
  iVar1 = munmap(region,size);
  if (iVar1 != 0) {
    syscall(1,2,
            "Check failed: munmap_result == 0: LowLevelAlloc::DeleteArena: munmap failed address\n",
            0x54);
    abort();
  }
  return;
}

Assistant:

void DefaultPagesAllocator::UnMapPages(void *region, size_t size) {
  size_t pagesize = cached_pagesize();
  (void)pagesize;

  RAW_CHECK(reinterpret_cast<intptr_t>(region) % pagesize == 0,
            "empty arena has non-page-aligned block");
  RAW_CHECK(size % pagesize == 0,
            "empty arena has non-page-aligned size");

  int munmap_result = munmap(region, size);
  RAW_CHECK(munmap_result == 0,
            "LowLevelAlloc::DeleteArena: munmap failed address");
}